

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createInstanceTest(TestStatus *__return_storage_ptr__,Context *context)

{
  void **this;
  TestLog *log;
  PlatformInterface *vk;
  qpTestResult qVar1;
  void **this_00;
  long lVar2;
  ulong uVar3;
  VkApplicationInfo *value;
  vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> appInfos;
  VkApplicationInfo appInfo;
  RefBase<vk::VkInstance_s_*> local_e8;
  VkInstanceCreateInfo instanceCreateInfo;
  ResultCollector resultCollector;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&appInfo,"",(allocator<char> *)&instanceCreateInfo);
  tcu::ResultCollector::ResultCollector(&resultCollector,log,(string *)&appInfo);
  std::__cxx11::string::~string((string *)&appInfo);
  vk = context->m_platformInterface;
  appInfos.super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  appInfos.super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  appInfos.super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
    appInfo._0_8_ = appInfo._0_8_ & 0xffffffff00000000;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = *(char **)((long)&PTR_anon_var_dwarf_136fa4_00bc7f00 + lVar2);
    appInfo._24_8_ = appInfo._24_8_ & 0xffffffff00000000;
    appInfo.pEngineName = "engineName";
    appInfo.engineVersion = 0;
    appInfo.apiVersion = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              (&appInfos,&appInfo);
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
    appInfo._0_8_ = appInfo._0_8_ & 0xffffffff00000000;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = "appName";
    appInfo._24_8_ = appInfo._24_8_ & 0xffffffff00000000;
    appInfo.pEngineName = *(char **)((long)&PTR_anon_var_dwarf_13701c_00bc7f40 + lVar2);
    appInfo.engineVersion = 0;
    appInfo.apiVersion = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              (&appInfos,&appInfo);
  }
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    appInfo._0_8_ = appInfo._0_8_ & 0xffffffff00000000;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = "appName";
    appInfo.applicationVersion = *(deUint32 *)((long)&DAT_00941074 + lVar2);
    appInfo.pEngineName = "engineName";
    appInfo.engineVersion = 0;
    appInfo.apiVersion = 0x400000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              (&appInfos,&appInfo);
  }
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    appInfo._0_8_ = appInfo._0_8_ & 0xffffffff00000000;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = "appName";
    appInfo._24_8_ = appInfo._24_8_ & 0xffffffff00000000;
    appInfo.pEngineName = "engineName";
    appInfo.apiVersion = 0x400000;
    appInfo.engineVersion = *(deUint32 *)((long)&DAT_00941074 + lVar2);
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              (&appInfos,&appInfo);
  }
  for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 4) {
    appInfo._0_8_ = appInfo._0_8_ & 0xffffffff00000000;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = "appName";
    appInfo._24_8_ = appInfo._24_8_ & 0xffffffff00000000;
    appInfo.pEngineName = "engineName";
    appInfo._40_8_ = (ulong)*(uint *)((long)&DAT_00941050 + lVar2) << 0x20 | 0x40000000000000;
    std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
              (&appInfos,&appInfo);
  }
  appInfo.pEngineName = "engineName";
  appInfo.engineVersion = 0;
  appInfo.apiVersion = 0;
  appInfo.pApplicationName = "appName";
  appInfo.applicationVersion = 0;
  appInfo._28_4_ = 0;
  appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo._4_4_ = 0;
  appInfo.pNext = (void *)0x0;
  std::vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::push_back
            (&appInfos,&appInfo);
  this = &appInfo.pNext;
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    this_00 = &appInfo.pNext;
    if ((ulong)(((long)appInfos.
                       super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)appInfos.
                      super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar3) break;
    value = (VkApplicationInfo *)
            ((long)&(appInfos.
                     super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sType + lVar2);
    instanceCreateInfo.pNext = (void *)0x0;
    instanceCreateInfo.flags = 0;
    instanceCreateInfo._20_4_ = 0;
    instanceCreateInfo.enabledExtensionCount = 0;
    instanceCreateInfo._52_4_ = 0;
    instanceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
    instanceCreateInfo.enabledLayerCount = 0;
    instanceCreateInfo._36_4_ = 0;
    instanceCreateInfo.ppEnabledLayerNames = (char **)0x0;
    instanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    instanceCreateInfo._4_4_ = 0;
    appInfo._0_8_ = log;
    instanceCreateInfo.pApplicationInfo = value;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Creating instance with appInfo: ");
    ::vk::operator<<((ostream *)this_00,value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&appInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    ::vk::createInstance
              ((Move<vk::VkInstance_s_*> *)&appInfo,vk,&instanceCreateInfo,
               (VkAllocationCallbacks *)0x0);
    local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)appInfo.pApplicationName;
    local_e8.m_data.object = (VkInstance_s *)appInfo._0_8_;
    local_e8.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)appInfo.pNext;
    appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo._4_4_ = 0;
    appInfo.pNext = (void *)0x0;
    appInfo.pApplicationName = (char *)0x0;
    ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&appInfo)
    ;
    appInfo._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"Succeeded");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&appInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_e8);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x30;
  }
  qVar1 = tcu::ResultCollector::getResult(&resultCollector);
  std::__cxx11::string::string((string *)&appInfo,(string *)&resultCollector.m_message);
  __return_storage_ptr__->m_code = qVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&appInfo);
  std::__cxx11::string::~string((string *)&appInfo);
  std::_Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>::~_Vector_base
            (&appInfos.
              super__Vector_base<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_>);
  tcu::ResultCollector::~ResultCollector(&resultCollector);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const char*					appNames[]				= { "appName", DE_NULL, "",  "app, name", "app(\"name\"", "app~!@#$%^&*()_+name", "app\nName", "app\r\nName" };
	const char*					engineNames[]			= { "engineName", DE_NULL, "",  "engine. name", "engine\"(name)", "eng~!@#$%^&*()_+name", "engine\nName", "engine\r\nName" };
	const int                   patchNumbers[]          = { 0, 1, 2, 3, 4, 5, 13, 4094, 4095 };
	const deUint32				appVersions[]			= { 0, 1, (deUint32)-1 };
	const deUint32				engineVersions[]		= { 0, 1, (deUint32)-1 };
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();
	vector<VkApplicationInfo>	appInfos;

	// test over appName
	for (int appNameNdx = 0; appNameNdx < DE_LENGTH_OF_ARRAY(appNames); appNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			appNames[appNameNdx],					// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineName
	for (int engineNameNdx = 0; engineNameNdx < DE_LENGTH_OF_ARRAY(engineNames); engineNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			engineNames[engineNameNdx],				// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over appVersion
	for (int appVersionNdx = 0; appVersionNdx < DE_LENGTH_OF_ARRAY(appVersions); appVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			appVersions[appVersionNdx],				// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineVersion
	for (int engineVersionNdx = 0; engineVersionNdx < DE_LENGTH_OF_ARRAY(engineVersions); engineVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			engineVersions[engineVersionNdx],		// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}
	// patch component of api version checking (should be ignored by implementation)
	for (int patchVersion = 0; patchVersion < DE_LENGTH_OF_ARRAY(patchNumbers); patchVersion++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,					// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			"appName",											// const char*					pAppName;
			0u,													// deUint32						appVersion;
			"engineName",										// const char*					pEngineName;
			0u,													// deUint32						engineVersion;
			VK_MAKE_VERSION(1, 0, patchNumbers[patchVersion]),	// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test when apiVersion is 0
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			0u,										// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// run the tests!
	for (size_t appInfoNdx = 0; appInfoNdx < appInfos.size(); ++appInfoNdx)
	{
		const VkApplicationInfo&		appInfo					= appInfos[appInfoNdx];
		const VkInstanceCreateInfo		instanceCreateInfo		=
		{
			VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
			&appInfo,								// const VkApplicationInfo*		pAppInfo;
			0u,										// deUint32						layerCount;
			DE_NULL,								// const char*const*			ppEnabledLayernames;
			0u,										// deUint32						extensionCount;
			DE_NULL,								// const char*const*			ppEnabledExtensionNames;
		};

		log << TestLog::Message << "Creating instance with appInfo: " << appInfo << TestLog::EndMessage;

		try
		{
			const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
			log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
		}
		catch (const vk::Error& err)
		{
			resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
		}
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}